

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 01.cpp
# Opt level: O3

int main(void)

{
  size_t sVar1;
  long *plVar2;
  char eme [8];
  char local_18 [8];
  
  setlocale(6,"portuguese-brazilian");
  builtin_strncpy(local_18,"\x1b[1;35m",8);
  sVar1 = strlen(local_18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_18,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Quatro regras simples para a vida no esconderijo: ",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Um: Nunca confie em um policial vestido de abrigo.",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Dois: Cuidado com o entusiasmo e com o amor.",0x2c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_90e,0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_924,0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Olhe fundo dentro daquele que o perguntou.",0x2a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_950,0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_966,0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  plVar2 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,anon_var_dwarf_97c,0x45);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  return 0;
}

Assistant:

int main()
{
    setlocale(LC_ALL, "portuguese-brazilian");
    char eme[] = {0x1b, '[', '1', ';', '3', '5', 'm', 0};
    cout << eme;

    cout << "Quatro regras simples para a vida no esconderijo: " << endl
         << endl;
    cout << "Um: Nunca confie em um policial vestido de abrigo." << endl
         << endl;
    cout << "Dois: Cuidado com o entusiasmo e com o amor." << endl;
    cout << "Ambos são temporários da maneira mais ligeira." << endl
         << endl;
    cout << "Três: Quando perguntado se você se importa com o mundo..." << endl;
    cout << "Olhe fundo dentro daquele que o perguntou." << endl;
    cout << "Ele não perguntará novamente." << endl
         << endl;
    cout << "Quatro: Nunca dê seu nome verdadeiro." << endl
         << endl;
    cout << "Cinco? Se algum dia lhe pedirem que olhe pra sí mesmo,nunca o faça." << endl;

    return 0;
}